

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O0

void ipx::Transpose(SparseMatrix *A,SparseMatrix *AT)

{
  Int IVar1;
  char *pcVar2;
  reference pvVar3;
  Int *pIVar4;
  uint *puVar5;
  int __c;
  uint __c_00;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  SparseMatrix *in_RSI;
  SparseMatrix *in_RDI;
  Int put;
  Int p_1;
  Int j;
  Int i;
  Int sum;
  Int *ATp;
  Int p;
  vector<int,_std::allocator<int>_> work;
  Int nz;
  Int n;
  Int m;
  double *in_stack_ffffffffffffff38;
  Int pos;
  SparseMatrix *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff50;
  Int in_stack_ffffffffffffff58;
  Int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff64;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  uint local_50;
  vector<int,_std::allocator<int>_> local_38;
  Int local_1c;
  Int local_18;
  Int local_14;
  SparseMatrix *local_10;
  SparseMatrix *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = SparseMatrix::rows(in_RDI);
  local_18 = SparseMatrix::cols((SparseMatrix *)0x84d3b8);
  local_1c = SparseMatrix::entries((SparseMatrix *)0x84d3cc);
  SparseMatrix::resize
            ((SparseMatrix *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             (Int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  std::allocator<int>::allocator((allocator<int> *)0x84d414);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50
            );
  std::allocator<int>::~allocator((allocator<int> *)0x84d43a);
  uVar6 = extraout_RDX;
  for (local_50 = 0; (int)local_50 < local_1c; local_50 = local_50 + 1) {
    pcVar2 = SparseMatrix::index(local_8,(char *)(ulong)local_50,(int)uVar6);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)(int)pcVar2);
    *pvVar3 = *pvVar3 + 1;
    uVar6 = extraout_RDX_00;
  }
  pIVar4 = SparseMatrix::colptr((SparseMatrix *)0x84d4e5);
  local_5c = 0;
  for (local_60 = 0; local_60 < local_14; local_60 = local_60 + 1) {
    pIVar4[local_60] = local_5c;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_60);
    local_5c = *pvVar3 + local_5c;
    IVar1 = pIVar4[local_60];
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_60);
    *pvVar3 = IVar1;
  }
  pIVar4[local_14] = local_5c;
  for (local_64 = 0; local_64 < local_18; local_64 = local_64 + 1) {
    local_68 = SparseMatrix::begin(in_stack_ffffffffffffff40,
                                   (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    while( true ) {
      uVar7 = local_68;
      IVar1 = SparseMatrix::end(in_stack_ffffffffffffff40,
                                (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      pos = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      if (IVar1 <= (int)uVar7) break;
      pcVar2 = SparseMatrix::index(local_8,(char *)(ulong)local_68,__c);
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_38,(long)(int)pcVar2);
      uVar7 = *puVar5;
      __c_00 = uVar7 + 1;
      *puVar5 = __c_00;
      in_stack_ffffffffffffff50 =
           (allocator_type *)SparseMatrix::index(local_10,(char *)(ulong)uVar7,__c_00);
      *(int *)in_stack_ffffffffffffff50 = local_64;
      in_stack_ffffffffffffff40 = (SparseMatrix *)SparseMatrix::value(in_stack_ffffffffffffff40,pos)
      ;
      in_stack_ffffffffffffff38 = SparseMatrix::value(in_stack_ffffffffffffff40,pos);
      *in_stack_ffffffffffffff38 = (double)in_stack_ffffffffffffff40;
      local_68 = local_68 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

void Transpose(const SparseMatrix& A, SparseMatrix& AT) {
    const Int m = A.rows();
    const Int n = A.cols();
    const Int nz = A.entries();
    AT.resize(n, m, nz);

    // Compute row counts of A in workspace.
    std::vector<Int> work(m);
    for (Int p = 0; p < nz; p++)
        work[A.index(p)]++;

    // Set column pointers for AT.
    Int* ATp = AT.colptr();
    Int sum = 0;
    for (Int i = 0; i < m; i++) {
        ATp[i] = sum;
        sum += work[i];
        work[i] = ATp[i];
    }
    assert(sum == nz);
    ATp[m] = sum;

    // Fill AT with one column of A at a time.
    // work[i] is the next free slot in column i of AT.
    for (Int j = 0; j < n; j++) {
        for (Int p = A.begin(j); p < A.end(j); p++) {
            Int put = work[A.index(p)]++;
            AT.index(put) = j;
            AT.value(put) = A.value(p);
        }
    }
}